

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildUint16x8_1Bool16x8_1Uint16x8_2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot)

{
  code *pcVar1;
  bool bVar2;
  OpCode opcode_00;
  RegOpnd *pRVar3;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *this_00;
  Instr *pIVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  OpCode opcode;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *src3Opnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  pRVar3 = BuildSrcOpnd(this,src1RegSlot,TySimd128B8);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128U8);
  src1_00 = BuildSrcOpnd(this,src3RegSlot,TySimd128U8);
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128U8);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&src1->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&src1_00->super_Opnd,ValueType::Simd);
  pIVar4 = AddExtendedArg(this,pRVar3,(RegOpnd *)0x0,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1,pRVar3,offset);
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pRVar3 = IR::Opnd::AsRegOpnd(pOVar5);
  pIVar4 = AddExtendedArg(this,src1_00,pRVar3,offset);
  opcode_00 = GetSimdOpcode(this,newOpcode);
  if (opcode_00 != Simd128_Select_U8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1686,"(opcode == Js::OpCode::Simd128_Select_U8)",
                       "Unexpected opcode for this format.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar5 = IR::Instr::GetDst(pIVar4);
  pIVar4 = IR::Instr::New(opcode_00,&this_00->super_Opnd,pOVar5,this->m_func);
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildUint16x8_1Bool16x8_1Uint16x8_2(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG4)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128B8);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128U8);
    IR::RegOpnd * src3Opnd = BuildSrcOpnd(src3RegSlot, TySimd128U8);
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
    IR::Instr * instr = nullptr;

    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);
    src3Opnd->SetValueType(ValueType::Simd);

    // Given bytecode: dst = op s1, s2, s3
    // Generate:
    // t1 = ExtendedArg_A s1
    // t2 = ExtendedArg_A s2, t1
    // t3 = ExtendedArg_A s3, t2
    // dst = op t3
    // Later phases will chain the arguments by following singleDefInstr of each use of ti.

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Js::OpCode opcode = GetSimdOpcode(newOpcode);

    AssertMsg(opcode == Js::OpCode::Simd128_Select_U8, "Unexpected opcode for this format.");
    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}